

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_amr.cpp
# Opt level: O3

void Omega_h::amr::remove_non_leaf_uses(Mesh *mesh)

{
  int *piVar1;
  uint high_dim;
  Alloc *pAVar2;
  pointer *ppsVar3;
  long lVar4;
  pointer *ppsVar5;
  ulong uVar6;
  ulong uVar7;
  LOs new_ents2old_ents [4];
  Bytes ent_persists [4];
  Read<signed_char> local_e8;
  Read<signed_char> local_d8;
  undefined1 local_c8 [64];
  pointer local_88 [11];
  
  local_88[8] = (pointer)0x0;
  local_88[9] = (pointer)0x0;
  local_88[6] = (pointer)0x0;
  local_88[7] = (pointer)0x0;
  local_88[4] = (pointer)0x0;
  local_88[5] = (pointer)0x0;
  local_88[2] = (pointer)0x0;
  local_88[3] = (pointer)0x0;
  high_dim = mesh->dim_;
  uVar6 = (ulong)high_dim;
  if (uVar6 < 4) {
    Omega_h::Mesh::ask_leaves((Mesh *)local_c8,(Int)mesh);
    ppsVar3 = local_88 + uVar6 * 2 + 2;
    pAVar2 = (Alloc *)*ppsVar3;
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
      }
    }
    *ppsVar3 = (pointer)local_c8._0_8_;
    local_88[uVar6 * 2 + 3] = (pointer)local_c8._8_8_;
    if (((local_c8._0_8_ & 7) == 0 && (Alloc *)local_c8._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_c8._0_8_ + 0x30) = *(int *)(local_c8._0_8_ + 0x30) + -1;
      *ppsVar3 = (pointer)((long)((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   *)local_c8._0_8_)->_M_ptr * 8 + 1);
    }
    if (uVar6 != 0) {
      ppsVar5 = local_88;
      uVar7 = 0;
      do {
        ppsVar5 = ppsVar5 + 2;
        local_d8.write_.shared_alloc_.alloc = (Alloc *)*ppsVar3;
        if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_d8.write_.shared_alloc_.alloc =
                 (Alloc *)((long)((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   *)&(local_d8.write_.shared_alloc_.alloc)->size)->_M_ptr * 8 + 1);
          }
          else {
            (local_d8.write_.shared_alloc_.alloc)->use_count =
                 (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_d8.write_.shared_alloc_.direct_ptr = local_88[uVar6 * 2 + 3];
        mark_down((Omega_h *)local_c8,mesh,high_dim,(Int)uVar7,&local_d8);
        pAVar2 = (Alloc *)*ppsVar5;
        if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
          piVar1 = &pAVar2->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar2);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_d8.write_.shared_alloc_.alloc;
        *ppsVar5 = (pointer)local_c8._0_8_;
        ppsVar5[1] = (pointer)local_c8._8_8_;
        if (((local_c8._0_8_ & 7) == 0 && (Alloc *)local_c8._0_8_ != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          *(int *)(local_c8._0_8_ + 0x30) = *(int *)(local_c8._0_8_ + 0x30) + -1;
          *ppsVar5 = (pointer)((long)((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                       *)local_c8._0_8_)->_M_ptr * 8 + 1);
        }
        local_c8._0_8_ = (Alloc *)0x0;
        local_c8._8_8_ = (element_type *)0x0;
        if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    local_c8._48_8_ = (pointer)0x0;
    local_c8._56_8_ = (pointer)0x0;
    local_c8._32_4_ = 0;
    local_c8._36_4_ = 0;
    local_c8._40_4_ = 0;
    local_c8._44_4_ = 0;
    local_c8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._24_4_ = 0;
    local_c8._28_4_ = 0;
    local_c8._0_8_ = (Alloc *)0x0;
    local_c8._8_8_ = (element_type *)0x0;
    lVar4 = 0;
    do {
      local_e8.write_.shared_alloc_.alloc = *(Alloc **)((long)local_88 + lVar4 + 0x10);
      if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e8.write_.shared_alloc_.alloc =
               (Alloc *)((local_e8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_e8.write_.shared_alloc_.alloc)->use_count =
               (local_e8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_e8.write_.shared_alloc_.direct_ptr = *(void **)((long)local_88 + lVar4 + 0x18);
      collect_marked((Omega_h *)local_88,&local_e8);
      pAVar2 = *(Alloc **)(local_c8 + lVar4);
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_e8.write_.shared_alloc_.alloc;
      *(pointer *)(local_c8 + lVar4) = local_88[0];
      *(pointer *)(local_c8 + lVar4 + 8) = local_88[1];
      if ((((ulong)local_88[0] & 7) == 0 && local_88[0] != (pointer)0x0) &&
         (entering_parallel == '\x01')) {
        *(int *)&local_88[0][3].
                 super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&local_88[0][3].
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + -1;
        *(long *)(local_c8 + lVar4) =
             (long)(local_88[0]->
                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr *
             8 + 1;
      }
      local_88[0] = (pointer)0x0;
      local_88[1] = (pointer)0x0;
      if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(high_dim + 1) << 4 != lVar4);
    unmap_mesh(mesh,(LOs *)local_c8);
    lVar4 = 0x40;
    do {
      pAVar2 = *(Alloc **)((long)&local_d8.write_.shared_alloc_.alloc + lVar4);
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
        }
      }
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
    lVar4 = 0x40;
    do {
      pAVar2 = *(Alloc **)((long)local_88 + lVar4);
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
        }
      }
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Bytes enforce_2to1_refine(Mesh* mesh, Int bridge_dim, Bytes elems_are_marked) {
  auto elem_dim = mesh->dim();
  OMEGA_H_CHECK(bridge_dim > 0);
  OMEGA_H_CHECK(bridge_dim < elem_dim);
  auto is_elem_leaf = mesh->ask_leaves(elem_dim);
  auto is_bridge_leaf = mesh->ask_leaves(bridge_dim);
  auto elems2bridges = mesh->ask_down(elem_dim, bridge_dim);
  auto bridges2elems = mesh->ask_up(bridge_dim, elem_dim);
  auto nbridges_per_elem = Omega_h::hypercube_degree(elem_dim, bridge_dim);
  auto is_interior = Omega_h::mark_by_class_dim(mesh, bridge_dim, elem_dim);
  auto children = mesh->ask_children(bridge_dim, bridge_dim);
  Write<Byte> one_level_mark(mesh->nelems());
  auto f = OMEGA_H_LAMBDA(LO elem) {
    if (!is_elem_leaf[elem]) {
      one_level_mark[elem] = 0;
    } else if (elems_are_marked[elem]) {
      one_level_mark[elem] = 1;
    } else {
      one_level_mark[elem] = should_elem_be_refined(elem, elems2bridges,
          bridges2elems, is_interior, is_bridge_leaf, nbridges_per_elem,
          children, elems_are_marked, one_level_mark);
    }
  };
  Omega_h::parallel_for(mesh->nelems(), f, "enforce_one_level");
  return one_level_mark;
}